

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O2

void AddOneKey(Keygroup *keygroup,PClassActor *mi,FScanner *sc)

{
  BYTE *pBVar1;
  bool bVar2;
  char *pcVar3;
  char *message;
  OneKey k;
  OneKey local_28;
  
  if (mi == (PClassActor *)0x0) {
    pcVar3 = sc->String;
    message = "Unknown item \'%s\'";
  }
  else {
    bVar2 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&mi->super_PClass);
    if (bVar2) {
      local_28.count = 1;
      local_28.key = mi;
      TArray<OneKey,_OneKey>::Push(&keygroup->anykeylist,&local_28);
      bVar2 = PClass::IsAncestorOf(AKey::RegistrationInfo.MyClass,&mi->super_PClass);
      if (((bVar2) && (ignorekey == '\0')) &&
         (pBVar1 = (mi->super_PClass).Defaults, pBVar1[0x4dc] == '\0')) {
        currentnumber = currentnumber + 1;
        pBVar1[0x4dc] = (BYTE)currentnumber;
      }
      return;
    }
    pcVar3 = sc->String;
    message = "\'%s\' is not an inventory item";
  }
  FScanner::ScriptError(sc,message,pcVar3);
  return;
}

Assistant:

static void AddOneKey(Keygroup *keygroup, PClassActor *mi, FScanner &sc)
{
	if (mi)
	{
		// Any inventory item can be used to unlock a door
		if (mi->IsDescendantOf(RUNTIME_CLASS(AInventory)))
		{
			OneKey k = {mi,1};
			keygroup->anykeylist.Push (k);

			//... but only keys get key numbers!
			if (mi->IsDescendantOf(RUNTIME_CLASS(AKey)))
			{
				if (!ignorekey &&
					static_cast<AKey*>(GetDefaultByType(mi))->KeyNumber == 0)
				{
					static_cast<AKey*>(GetDefaultByType(mi))->KeyNumber=++currentnumber;
				}
			}
		}
		else
		{
			sc.ScriptError("'%s' is not an inventory item", sc.String);
		}
	}
	else
	{
		sc.ScriptError("Unknown item '%s'", sc.String);
	}
}